

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O3

float __thiscall blinnPhong::pdf(blinnPhong *this,Ray *ray,Vector3f *dir,Hit *h)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined4 extraout_EAX;
  uint uVar7;
  float *pfVar8;
  Vector3f *rv;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  Vector3f ref_dir;
  Vector3f spec;
  Vector3f diff;
  Vector3f local_94;
  Vector3f local_88;
  Vector3f local_7c;
  Vector3f local_70;
  Vector3f local_64;
  Vector3f local_58;
  Vector3f local_4c;
  Vector3f local_40;
  Vector3f local_34;
  
  fVar13 = h->material->_shininess;
  Vector3f::Vector3f(&local_34,&h->material->_diffuseColor);
  Vector3f::Vector3f(&local_40,&h->material->_specularColor);
  pfVar8 = Vector3f::operator[](&local_34,0);
  fVar20 = *pfVar8;
  pfVar8 = Vector3f::operator[](&local_34,1);
  fVar1 = *pfVar8;
  pfVar8 = Vector3f::operator[](&local_34,2);
  fVar2 = *pfVar8;
  pfVar8 = Vector3f::operator[](&local_40,0);
  fVar3 = *pfVar8;
  pfVar8 = Vector3f::operator[](&local_40,1);
  fVar4 = *pfVar8;
  pfVar8 = Vector3f::operator[](&local_40,2);
  fVar5 = *pfVar8;
  rv = &h->normal;
  Vector3f::Vector3f(&local_94,rv);
  fVar9 = Vector3f::dot(dir,&local_94);
  Vector3f::Vector3f(&local_4c,&ray->_direction);
  Vector3f::Vector3f(&local_64,&ray->_direction);
  Vector3f::Vector3f(&local_70,rv);
  fVar10 = Vector3f::dot(&local_64,&local_70);
  Vector3f::Vector3f(&local_7c,rv);
  ::operator*(fVar10 + fVar10,&local_58);
  operator-(&local_4c,&local_58);
  Vector3f::normalized(&local_88);
  Vector3f::Vector3f(&local_88,rv);
  fVar10 = Vector3f::dot(&local_94,&local_88);
  fVar11 = 1.0 - fVar10 * fVar10;
  if (fVar11 < 0.0) {
    fVar11 = sqrtf(fVar11);
  }
  else {
    fVar11 = SQRT(fVar11);
  }
  dVar14 = fmod((double)fVar13,2.0);
  fVar21 = 3.1415927;
  fVar12 = 3.1415927;
  if ((dVar14 == 0.0) && (fVar21 = 3.1415927, !NAN(dVar14))) {
    fVar21 = fVar11 + fVar11;
  }
  if ((dVar14 == 0.0) && (!NAN(dVar14))) {
    dVar15 = acos((double)fVar10);
    fVar12 = (float)((3.141592653589793 - dVar15) + (3.141592653589793 - dVar15));
  }
  fVar18 = 0.0;
  fVar19 = 0.0;
  if ((dVar14 == 0.0) && (!NAN(dVar14))) {
    fVar19 = 1.0;
  }
  for (; fVar19 <= fVar13 + -1.0; fVar19 = fVar19 + 2.0) {
    fVar18 = fVar18 + fVar21;
    fVar21 = ((fVar19 + 1.0) * fVar21 * fVar11 * fVar11) / (fVar19 + 2.0);
  }
  fVar11 = Vector3f::dot(&local_94,dir);
  auVar16._0_8_ = pow((double)fVar11,(double)fVar13);
  auVar16._8_8_ = (double)fVar9;
  auVar17._8_4_ = 0x54442d18;
  auVar17._0_8_ = (double)((fVar10 * fVar18 + fVar12) / (fVar13 + 1.0));
  auVar17._12_4_ = 0x400921fb;
  auVar17 = divpd(auVar16,auVar17);
  fVar13 = (float)auVar17._0_8_;
  fVar9 = (float)auVar17._8_8_;
  auVar6._4_4_ = -(uint)(0.0 < fVar13);
  auVar6._0_4_ = -(uint)(0.0 < fVar13);
  auVar6._8_4_ = -(uint)(0.0 < fVar9);
  auVar6._12_4_ = -(uint)(0.0 < fVar9);
  uVar7 = movmskpd(extraout_EAX,auVar6);
  if ((uVar7 & 2) == 0) {
    fVar9 = 0.0;
  }
  fVar20 = 1.0 / ((fVar20 + fVar1 + fVar2) / (fVar3 + fVar4 + fVar5) + 1.0);
  if ((uVar7 & 1) == 0) {
    fVar13 = 0.0;
  }
  return fVar13 * fVar20 + (1.0 - fVar20) * fVar9;
}

Assistant:

float blinnPhong::pdf(const Ray &ray, const Vector3f &dir, Hit &h) const {
    float shininess = h.getMaterial()->getShininess();
    Vector3f diff = h.getMaterial()->getDiffuseColor();
    Vector3f spec = h.getMaterial()->getSpecularColor();
    float prob_spec = 1.f / (1.f + (diff[0] + diff[1] + diff[2]) / (spec[0] + spec[1] + spec[2]));

    float diffuse_pdf = Vector3f::dot(dir, h.getNormal()) / M_PI;
    diffuse_pdf = diffuse_pdf > 0 ? diffuse_pdf : 0;


    Vector3f ref_dir = (ray.getDirection() - 2 * Vector3f::dot(ray.getDirection(), h.getNormal()) * h.getNormal()).normalized();
    float S = 0;
    float d = Vector3f::dot(ref_dir, h.getNormal());
    float c = sqrt(1-d*d);
    bool even = fmod(shininess, 2.) == 0.;
    float T = even ? 2.f*c : (float)M_PI;
    float A = even ? (float)2*(M_PI-acos(d)) : (float)M_PI;
    float i = even ? 1 : 0;

    while (i <= shininess-1) {
        S = S+T;
        T = T*c*c*(i+1.)/(i+2.);
        i = i+2;
    }

    float specular_norm = (A + d*(S)) / (shininess+1);
    float specular_pdf = pow(Vector3f::dot(ref_dir, dir), shininess) / specular_norm;
    specular_pdf = specular_pdf > 0 ? specular_pdf : 0;

    return prob_spec * specular_pdf + (1-prob_spec) * diffuse_pdf;

}